

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmseventreader.cpp
# Opt level: O0

void __thiscall QEglFSKmsEventReader::destroy(QEglFSKmsEventReader *this)

{
  long lVar1;
  undefined8 uVar2;
  long *plVar3;
  bool bVar4;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff98;
  QDeadlineTimer *pQVar5;
  QDeadlineTimer *in_stack_ffffffffffffffa0;
  QMessageLogger *this_00;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1._0_4_ = (in_RDI->context).version;
  lVar1._4_4_ = (in_RDI->context).line;
  if (lVar1 != 0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    this_00 = in_RDI;
    QtPrivateLogging::qLcEglfsKmsDebug();
    anon_unknown.dwarf_257fd::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    while (bVar4 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar4) {
      anon_unknown.dwarf_257fd::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x10a8e4);
      QMessageLogger::QMessageLogger
                (this_00,(char *)in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                 (char *)in_stack_ffffffffffffff98,(char *)0x10a8fa);
      uVar2._0_4_ = (in_RDI->context).version;
      uVar2._4_4_ = (in_RDI->context).line;
      QMessageLogger::debug(local_38,"Stopping event reader for device %p",uVar2);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    if ((in_RDI->context).file != (char *)0x0) {
      QThread::quit();
      pQVar5 = (QDeadlineTimer *)(in_RDI->context).file;
      QDeadlineTimer::QDeadlineTimer
                (in_stack_ffffffffffffffa0,(ForeverConstant)((ulong)pQVar5 >> 0x20),
                 (TimerType)pQVar5);
      QThread::wait(pQVar5);
      plVar3 = (long *)(in_RDI->context).file;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x20))();
      }
      (in_RDI->context).file = (char *)0x0;
    }
    (in_RDI->context).version = 0;
    (in_RDI->context).line = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSKmsEventReader::destroy()
{
    if (!m_device)
        return;

    qCDebug(qLcEglfsKmsDebug, "Stopping event reader for device %p", m_device);

    if (m_thread) {
        m_thread->quit();
        m_thread->wait();
        delete m_thread;
        m_thread = nullptr;
    }

    m_device = nullptr;
}